

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_iov.c
# Opt level: O1

int mk_iov_consume(mk_iov *mk_io,size_t bytes)

{
  long *plVar1;
  int iVar2;
  size_t sVar3;
  iovec *piVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  
  sVar3 = mk_io->total_len;
  if (sVar3 == bytes) {
    mk_io->total_len = 0;
    mk_io->iov_idx = 0;
  }
  else {
    iVar2 = mk_io->iov_idx;
    if (0 < (long)iVar2) {
      piVar4 = mk_io->io;
      lVar6 = 0;
      do {
        uVar5 = *(ulong *)((long)&piVar4->iov_len + lVar6);
        uVar7 = bytes;
        if (uVar5 != 0) {
          uVar7 = bytes - uVar5;
          if (bytes < uVar5) {
            plVar1 = (long *)((long)&piVar4->iov_base + lVar6);
            *plVar1 = *plVar1 + bytes;
            *(ulong *)((long)&piVar4->iov_len + lVar6) = uVar5 - bytes;
            break;
          }
          *(undefined8 *)((long)&piVar4->iov_len + lVar6) = 0;
          if (uVar7 == 0) break;
        }
        lVar6 = lVar6 + 0x10;
        bytes = uVar7;
      } while ((long)iVar2 * 0x10 != lVar6);
    }
    mk_io->total_len = sVar3 - bytes;
  }
  return 0;
}

Assistant:

int mk_iov_consume(struct mk_iov *mk_io, size_t bytes)
{
    int i;
    size_t len;

    if (mk_io->total_len == bytes) {
        mk_io->total_len = 0;
        mk_io->iov_idx   = 0;
        return 0;
    }

    for (i = 0; i < mk_io->iov_idx; i++) {
        len = mk_io->io[i].iov_len;
        if (len == 0) {
            continue;
        }

        if (bytes < len) {
            mk_io->io[i].iov_base = (uint8_t *)mk_io->io[i].iov_base + bytes;
            mk_io->io[i].iov_len   = (len - bytes);
            break;
        }
        else if (bytes == len) {
            /* this entry was consumed */
            mk_io->io[i].iov_len = 0;
            break;
        }
        else {
            /* bytes > 0, consume this entry */
            mk_io->io[i].iov_len = 0;
            bytes -= len;
        }
    }

    mk_io->total_len -= (unsigned long)bytes;
    return 0;
}